

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O1

bool __thiscall
glslang::TOutputTraverser::visitUnary(TOutputTraverser *this,TVisit param_1,TIntermUnary *node)

{
  TOperator TVar1;
  TInfoSink *infoSink;
  int iVar2;
  TBasicType TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  char *pcVar5;
  undefined4 extraout_var_01;
  TInfoSinkBase *pTVar6;
  TString local_40;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[4])
                    (node);
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 0xb8) == 0x12) {
    pTVar6 = &infoSink->debug;
    TInfoSinkBase::append(pTVar6,"Convert ");
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x31])(node);
    plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))
                               ((long *)CONCAT44(extraout_var_00,iVar2));
    TVar3 = (**(code **)(*plVar4 + 0x38))(plVar4);
    pcVar5 = TType::getBasicString(TVar3);
    TInfoSinkBase::append(pTVar6,pcVar5);
    TInfoSinkBase::append(pTVar6," to ");
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1e])(node);
    TVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x38))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    pcVar5 = TType::getBasicString(TVar3);
    TInfoSinkBase::append(pTVar6,pcVar5);
    goto LAB_003ee95c;
  }
  TVar1 = (node->super_TIntermOperator).op;
  switch(TVar1) {
  case EOpSpirvInst:
    pcVar5 = "spirv_instruction";
    break;
  case EOpNegative:
    pcVar5 = "Negate value";
    break;
  case EOpLogicalNot:
  case EOpVectorLogicalNot:
    pcVar5 = "Negate conditional";
    break;
  case EOpBitwiseNot:
    pcVar5 = "Bitwise not";
    break;
  case EOpPostIncrement:
    pcVar5 = "Post-Increment";
    break;
  case EOpPostDecrement:
    pcVar5 = "Post-Decrement";
    break;
  case EOpPreIncrement:
    pcVar5 = "Pre-Increment";
    break;
  case EOpPreDecrement:
    pcVar5 = "Pre-Decrement";
    break;
  case EOpCopyObject:
    pcVar5 = "copy object";
    break;
  case EOpDeclare:
    pcVar5 = "Declare";
    break;
  case EOpConvNumeric:
  case EOpConvUvec2ToPtr:
  case EOpConvPtrToUvec2:
  case EOpAdd:
  case EOpSub:
  case EOpMul:
  case EOpDiv:
  case EOpMod:
  case EOpRightShift:
  case EOpLeftShift:
  case EOpAnd:
  case EOpInclusiveOr:
  case EOpExclusiveOr:
  case EOpEqual:
  case EOpNotEqual:
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
  case EOpComma:
  case EOpVectorTimesScalar:
  case EOpVectorTimesMatrix:
  case EOpMatrixTimesVector:
  case EOpMatrixTimesScalar:
  case EOpLogicalOr:
  case EOpLogicalXor:
  case EOpLogicalAnd:
  case EOpIndexDirect:
  case EOpIndexIndirect:
  case EOpIndexDirectStruct:
  case EOpVectorSwizzle:
  case EOpMethod:
  case EOpScoping:
  case EOpPow:
  case EOpModf:
  case EOpMin:
  case EOpMax:
  case EOpClamp:
  case EOpMix:
  case EOpStep:
  case EOpSmoothStep:
  case EOpFma:
  case EOpFrexp:
  case EOpLdexp:
  case EOpDistance:
  case EOpDot:
  case EOpCross:
  case EOpFaceForward:
  case EOpReflect:
  case EOpRefract:
  case EOpMin3:
  case EOpMax3:
  case EOpMid3:
  case EOpInterpolateAtSample:
  case EOpInterpolateAtOffset:
  case EOpInterpolateAtVertex:
  case EOpMatrixTimesMatrix:
  case EOpOuterProduct:
  case EOpFtransform:
  case EOpEmitVertex:
  case EOpEndPrimitive:
  case EOpBarrier:
  case EOpMemoryBarrier:
  case EOpMemoryBarrierAtomicCounter:
  case EOpMemoryBarrierBuffer:
  case EOpMemoryBarrierImage:
  case EOpMemoryBarrierShared:
  case EOpGroupMemoryBarrier:
  case EOpReadInvocation:
  case EOpSubgroupGuardStart:
  case EOpSubgroupBarrier:
  case EOpSubgroupMemoryBarrier:
  case EOpSubgroupMemoryBarrierBuffer:
  case EOpSubgroupMemoryBarrierImage:
  case EOpSubgroupMemoryBarrierShared:
  case EOpSubgroupGuardStop:
  case EOpDotPackedEXT:
  case EOpDotAccSatEXT:
  case EOpDotPackedAccSatEXT:
  case EOpSwizzleInvocations:
  case EOpSwizzleInvocationsMasked:
  case EOpWriteInvocation:
  case EOpTime:
  case EOpAtomicAdd:
  case EOpAtomicSubtract:
  case EOpAtomicMin:
  case EOpAtomicMax:
  case EOpAtomicAnd:
  case EOpAtomicOr:
  case EOpAtomicXor:
  case EOpAtomicExchange:
  case EOpAtomicCompSwap:
  case EOpAtomicLoad:
  case EOpAtomicStore:
  case EOpAtomicCounterAdd:
  case EOpAtomicCounterSubtract:
  case EOpAtomicCounterMin:
  case EOpAtomicCounterMax:
  case EOpAtomicCounterAnd:
  case EOpAtomicCounterOr:
  case EOpAtomicCounterXor:
  case EOpAtomicCounterExchange:
  case EOpAtomicCounterCompSwap:
  case EOpCooperativeMatrixLoad:
  case EOpCooperativeMatrixStore:
  case EOpCooperativeMatrixMulAdd:
  case EOpCooperativeMatrixLoadNV:
  case EOpCooperativeMatrixStoreNV:
  case EOpCooperativeMatrixLoadTensorNV:
  case EOpCooperativeMatrixStoreTensorNV:
  case EOpCooperativeMatrixMulAddNV:
  case EOpCooperativeMatrixReduceNV:
  case EOpCooperativeMatrixPerElementOpNV:
  case EOpCooperativeMatrixTransposeNV:
  case EOpCooperativeVectorMatMulNV:
  case EOpCooperativeVectorMatMulAddNV:
  case EOpCooperativeVectorLoadNV:
  case EOpCooperativeVectorStoreNV:
  case EOpCooperativeVectorOuterProductAccumulateNV:
  case EOpCooperativeVectorReduceSumAccumulateNV:
  case EOpBeginInvocationInterlock:
  case EOpEndInvocationInterlock:
  case EOpIsHelperInvocation:
  case EOpDebugPrintf:
  case EOpKill:
  case EOpTerminateInvocation:
  case EOpDemote:
  case EOpTerminateRayKHR:
  case EOpIgnoreIntersectionKHR:
  case EOpReturn:
  case EOpBreak:
  case EOpContinue:
  case EOpCase:
  case EOpDefault:
  case EOpConstructGuardStart:
  case EOpConstructInt:
  case EOpConstructUint:
  case EOpConstructInt8:
  case EOpConstructUint8:
  case EOpConstructInt16:
  case EOpConstructUint16:
  case EOpConstructInt64:
  case EOpConstructUint64:
  case EOpConstructBool:
  case EOpConstructFloat:
  case EOpConstructDouble:
  case EOpConstructVec2:
  case EOpConstructVec3:
  case EOpConstructVec4:
  case EOpConstructMat2x2:
  case EOpConstructMat2x3:
  case EOpConstructMat2x4:
  case EOpConstructMat3x2:
  case EOpConstructMat3x3:
  case EOpConstructMat3x4:
  case EOpConstructMat4x2:
  case EOpConstructMat4x3:
  case EOpConstructMat4x4:
  case EOpConstructDVec2:
  case EOpConstructDVec3:
  case EOpConstructDVec4:
  case EOpConstructBVec2:
  case EOpConstructBVec3:
  case EOpConstructBVec4:
  case EOpConstructI8Vec2:
  case EOpConstructI8Vec3:
  case EOpConstructI8Vec4:
  case EOpConstructU8Vec2:
  case EOpConstructU8Vec3:
  case EOpConstructU8Vec4:
  case EOpConstructI16Vec2:
  case EOpConstructI16Vec3:
  case EOpConstructI16Vec4:
  case EOpConstructU16Vec2:
  case EOpConstructU16Vec3:
  case EOpConstructU16Vec4:
  case EOpConstructIVec2:
  case EOpConstructIVec3:
  case EOpConstructIVec4:
  case EOpConstructUVec2:
  case EOpConstructUVec3:
  case EOpConstructUVec4:
  case EOpConstructI64Vec2:
  case EOpConstructI64Vec3:
  case EOpConstructI64Vec4:
  case EOpConstructU64Vec2:
  case EOpConstructU64Vec3:
  case EOpConstructU64Vec4:
  case EOpConstructDMat2x2:
  case EOpConstructDMat2x3:
  case EOpConstructDMat2x4:
  case EOpConstructDMat3x2:
  case EOpConstructDMat3x3:
  case EOpConstructDMat3x4:
  case EOpConstructDMat4x2:
  case EOpConstructDMat4x3:
  case EOpConstructDMat4x4:
  case EOpConstructIMat2x2:
  case EOpConstructIMat2x3:
  case EOpConstructIMat2x4:
  case EOpConstructIMat3x2:
  case EOpConstructIMat3x3:
  case EOpConstructIMat3x4:
  case EOpConstructIMat4x2:
  case EOpConstructIMat4x3:
  case EOpConstructIMat4x4:
  case EOpConstructUMat2x2:
  case EOpConstructUMat2x3:
  case EOpConstructUMat2x4:
  case EOpConstructUMat3x2:
  case EOpConstructUMat3x3:
  case EOpConstructUMat3x4:
  case EOpConstructUMat4x2:
  case EOpConstructUMat4x3:
  case EOpConstructUMat4x4:
  case EOpConstructBMat2x2:
  case EOpConstructBMat2x3:
  case EOpConstructBMat2x4:
  case EOpConstructBMat3x2:
  case EOpConstructBMat3x3:
  case EOpConstructBMat3x4:
  case EOpConstructBMat4x2:
  case EOpConstructBMat4x3:
  case EOpConstructBMat4x4:
  case EOpConstructFloat16:
  case EOpConstructF16Vec2:
  case EOpConstructF16Vec3:
  case EOpConstructF16Vec4:
  case EOpConstructF16Mat2x2:
  case EOpConstructF16Mat2x3:
  case EOpConstructF16Mat2x4:
  case EOpConstructF16Mat3x2:
  case EOpConstructF16Mat3x3:
  case EOpConstructF16Mat3x4:
  case EOpConstructF16Mat4x2:
  case EOpConstructF16Mat4x3:
  case EOpConstructF16Mat4x4:
  case EOpConstructStruct:
  case EOpConstructTextureSampler:
  case EOpConstructNonuniform:
  case EOpConstructCooperativeMatrixNV:
  case EOpConstructCooperativeMatrixKHR:
  case EOpConstructCooperativeVectorNV:
  case EOpConstructAccStruct:
  case EOpConstructGuardEnd:
  case EOpAssign:
  case EOpAddAssign:
  case EOpSubAssign:
  case EOpMulAssign:
  case EOpVectorTimesMatrixAssign:
  case EOpVectorTimesScalarAssign:
  case EOpMatrixTimesScalarAssign:
  case EOpMatrixTimesMatrixAssign:
  case EOpDivAssign:
  case EOpModAssign:
  case EOpAndAssign:
  case EOpInclusiveOrAssign:
  case EOpExclusiveOrAssign:
  case EOpLeftShiftAssign:
  case EOpRightShiftAssign:
  case EOpImageGuardBegin:
  case EOpImageStore:
  case EOpImageLoadLod:
  case EOpImageStoreLod:
  case EOpImageAtomicAdd:
  case EOpImageAtomicMin:
  case EOpImageAtomicMax:
  case EOpImageAtomicAnd:
  case EOpImageAtomicOr:
  case EOpImageAtomicXor:
  case EOpImageAtomicExchange:
  case EOpImageAtomicCompSwap:
  case EOpImageAtomicLoad:
  case EOpImageAtomicStore:
  case EOpSparseImageLoad:
  case EOpSparseImageLoadLod:
  case EOpImageGuardEnd:
  case EOpTextureGuardBegin:
  case EOpSamplingGuardBegin:
  case EOpTexture:
  case EOpTextureProj:
  case EOpTextureLod:
  case EOpTextureOffset:
  case EOpTextureFetch:
  case EOpTextureFetchOffset:
  case EOpTextureProjOffset:
  case EOpTextureLodOffset:
  case EOpTextureProjLod:
  case EOpTextureProjLodOffset:
  case EOpTextureGrad:
  case EOpTextureGradOffset:
  case EOpTextureProjGrad:
  case EOpTextureProjGradOffset:
  case EOpTextureGather:
  case EOpTextureGatherOffset:
  case EOpTextureGatherOffsets:
  case EOpTextureClamp:
  case EOpTextureOffsetClamp:
  case EOpTextureGradClamp:
  case EOpTextureGradOffsetClamp:
  case EOpTextureGatherLod:
  case EOpTextureGatherLodOffset:
  case EOpTextureGatherLodOffsets:
  case EOpSparseTextureGuardBegin:
  case EOpSparseTexture:
  case EOpSparseTextureLod:
  case EOpSparseTextureOffset:
  case EOpSparseTextureFetch:
  case EOpSparseTextureFetchOffset:
  case EOpSparseTextureLodOffset:
  case EOpSparseTextureGrad:
  case EOpSparseTextureGradOffset:
  case EOpSparseTextureGather:
  case EOpSparseTextureGatherOffset:
  case EOpSparseTextureGatherOffsets:
  case EOpSparseTextureClamp:
  case EOpSparseTextureOffsetClamp:
  case EOpSparseTextureGradClamp:
  case EOpSparseTextureGradOffsetClamp:
  case EOpSparseTextureGatherLod:
  case EOpSparseTextureGatherLodOffset:
  case EOpSparseTextureGatherLodOffsets:
  case EOpSparseTextureGuardEnd:
  case EOpImageFootprintGuardBegin:
  case EOpImageSampleFootprintNV:
  case EOpImageSampleFootprintClampNV:
  case EOpImageSampleFootprintLodNV:
  case EOpImageSampleFootprintGradNV:
  case EOpImageSampleFootprintGradClampNV:
  case EOpImageFootprintGuardEnd:
  case EOpSamplingGuardEnd:
  case EOpTextureGuardEnd:
  case EOpAddCarry:
  case EOpSubBorrow:
  case EOpUMulExtended:
  case EOpIMulExtended:
  case EOpBitfieldExtract:
  case EOpBitfieldInsert:
switchD_003ed9ad_caseD_12:
    TInfoSinkBase::message(&infoSink->debug,EPrefixError,"Bad unary op");
    goto LAB_003ee95c;
  case EOpConvUint64ToPtr:
    pcVar5 = "Convert uint64_t to pointer";
    break;
  case EOpConvPtrToUint64:
    pcVar5 = "Convert pointer to uint64_t";
    break;
  case EOpConvUint64ToAccStruct:
    pcVar5 = "Convert uint64_t to acceleration structure";
    break;
  case EOpConvUvec2ToAccStruct:
    pcVar5 = "Convert uvec2 to acceleration strucuture ";
    break;
  case EOpRadians:
    pcVar5 = "radians";
    break;
  case EOpDegrees:
    pcVar5 = "degrees";
    break;
  case EOpSin:
    pcVar5 = "sine";
    break;
  case EOpCos:
    pcVar5 = "cosine";
    break;
  case EOpTan:
    pcVar5 = "tangent";
    break;
  case EOpAsin:
    pcVar5 = "arc sine";
    break;
  case EOpAcos:
    pcVar5 = "arc cosine";
    break;
  case EOpAtan:
    pcVar5 = "arc tangent";
    break;
  case EOpSinh:
    pcVar5 = "hyp. sine";
    break;
  case EOpCosh:
    pcVar5 = "hyp. cosine";
    break;
  case EOpTanh:
    pcVar5 = "hyp. tangent";
    break;
  case EOpAsinh:
    pcVar5 = "arc hyp. sine";
    break;
  case EOpAcosh:
    pcVar5 = "arc hyp. cosine";
    break;
  case EOpAtanh:
    pcVar5 = "arc hyp. tangent";
    break;
  case EOpExp:
    pcVar5 = "exp";
    break;
  case EOpLog:
    pcVar5 = "log";
    break;
  case EOpExp2:
    pcVar5 = "exp2";
    break;
  case EOpLog2:
    pcVar5 = "log2";
    break;
  case EOpSqrt:
    pcVar5 = "sqrt";
    break;
  case EOpInverseSqrt:
    pcVar5 = "inverse sqrt";
    break;
  case EOpAbs:
    pcVar5 = "Absolute value";
    break;
  case EOpSign:
    pcVar5 = "Sign";
    break;
  case EOpFloor:
    pcVar5 = "Floor";
    break;
  case EOpTrunc:
    pcVar5 = "trunc";
    break;
  case EOpRound:
    pcVar5 = "round";
    break;
  case EOpRoundEven:
    pcVar5 = "roundEven";
    break;
  case EOpCeil:
    pcVar5 = "Ceiling";
    break;
  case EOpFract:
    pcVar5 = "Fraction";
    break;
  case EOpIsNan:
    pcVar5 = "isnan";
    break;
  case EOpIsInf:
    pcVar5 = "isinf";
    break;
  case EOpFloatBitsToInt:
    pcVar5 = "floatBitsToInt";
    break;
  case EOpFloatBitsToUint:
    pcVar5 = "floatBitsToUint";
    break;
  case EOpIntBitsToFloat:
    pcVar5 = "intBitsToFloat";
    break;
  case EOpUintBitsToFloat:
    pcVar5 = "uintBitsToFloat";
    break;
  case EOpDoubleBitsToInt64:
    pcVar5 = "doubleBitsToInt64";
    break;
  case EOpDoubleBitsToUint64:
    pcVar5 = "doubleBitsToUint64";
    break;
  case EOpInt64BitsToDouble:
    pcVar5 = "int64BitsToDouble";
    break;
  case EOpUint64BitsToDouble:
    pcVar5 = "uint64BitsToDouble";
    break;
  case EOpFloat16BitsToInt16:
    pcVar5 = "float16BitsToInt16";
    break;
  case EOpFloat16BitsToUint16:
    pcVar5 = "float16BitsToUint16";
    break;
  case EOpInt16BitsToFloat16:
    pcVar5 = "int16BitsToFloat16";
    break;
  case EOpUint16BitsToFloat16:
    pcVar5 = "uint16BitsToFloat16";
    break;
  case EOpPackSnorm2x16:
    pcVar5 = "packSnorm2x16";
    break;
  case EOpUnpackSnorm2x16:
    pcVar5 = "unpackSnorm2x16";
    break;
  case EOpPackUnorm2x16:
    pcVar5 = "packUnorm2x16";
    break;
  case EOpUnpackUnorm2x16:
    pcVar5 = "unpackUnorm2x16";
    break;
  case EOpPackSnorm4x8:
    pcVar5 = "PackSnorm4x8";
    break;
  case EOpUnpackSnorm4x8:
    pcVar5 = "UnpackSnorm4x8";
    break;
  case EOpPackUnorm4x8:
    pcVar5 = "PackUnorm4x8";
    break;
  case EOpUnpackUnorm4x8:
    pcVar5 = "UnpackUnorm4x8";
    break;
  case EOpPackHalf2x16:
    pcVar5 = "packHalf2x16";
    break;
  case EOpUnpackHalf2x16:
    pcVar5 = "unpackHalf2x16";
    break;
  case EOpPackDouble2x32:
    pcVar5 = "PackDouble2x32";
    break;
  case EOpUnpackDouble2x32:
    pcVar5 = "UnpackDouble2x32";
    break;
  case EOpPackInt2x32:
    pcVar5 = "packInt2x32";
    break;
  case EOpUnpackInt2x32:
    pcVar5 = "unpackInt2x32";
    break;
  case EOpPackUint2x32:
    pcVar5 = "packUint2x32";
    break;
  case EOpUnpackUint2x32:
    pcVar5 = "unpackUint2x32";
    break;
  case EOpPackFloat2x16:
    pcVar5 = "packFloat2x16";
    break;
  case EOpUnpackFloat2x16:
    pcVar5 = "unpackFloat2x16";
    break;
  case EOpPackInt2x16:
    pcVar5 = "packInt2x16";
    break;
  case EOpUnpackInt2x16:
    pcVar5 = "unpackInt2x16";
    break;
  case EOpPackUint2x16:
    pcVar5 = "packUint2x16";
    break;
  case EOpUnpackUint2x16:
    pcVar5 = "unpackUint2x16";
    break;
  case EOpPackInt4x16:
    pcVar5 = "packInt4x16";
    break;
  case EOpUnpackInt4x16:
    pcVar5 = "unpackInt4x16";
    break;
  case EOpPackUint4x16:
    pcVar5 = "packUint4x16";
    break;
  case EOpUnpackUint4x16:
    pcVar5 = "unpackUint4x16";
    break;
  case EOpPack16:
    pcVar5 = "pack16";
    break;
  case EOpPack32:
    pcVar5 = "pack32";
    break;
  case EOpPack64:
    pcVar5 = "pack64";
    break;
  case EOpUnpack32:
    pcVar5 = "unpack32";
    break;
  case EOpUnpack16:
    pcVar5 = "unpack16";
    break;
  case EOpUnpack8:
    pcVar5 = "unpack8";
    break;
  case EOpLength:
    pcVar5 = "length";
    break;
  case EOpNormalize:
    pcVar5 = "normalize";
    break;
  case EOpDPdx:
    pcVar5 = "dPdx";
    break;
  case EOpDPdy:
    pcVar5 = "dPdy";
    break;
  case EOpFwidth:
    pcVar5 = "fwidth";
    break;
  case EOpDPdxFine:
    pcVar5 = "dPdxFine";
    break;
  case EOpDPdyFine:
    pcVar5 = "dPdyFine";
    break;
  case EOpFwidthFine:
    pcVar5 = "fwidthFine";
    break;
  case EOpDPdxCoarse:
    pcVar5 = "dPdxCoarse";
    break;
  case EOpDPdyCoarse:
    pcVar5 = "dPdyCoarse";
    break;
  case EOpFwidthCoarse:
    pcVar5 = "fwidthCoarse";
    break;
  case EOpInterpolateAtCentroid:
    pcVar5 = "interpolateAtCentroid";
    break;
  case EOpDeterminant:
    pcVar5 = "determinant";
    break;
  case EOpMatrixInverse:
    pcVar5 = "inverse";
    break;
  case EOpTranspose:
    pcVar5 = "transpose";
    break;
  case EOpNoise:
    pcVar5 = "noise";
    break;
  case EOpEmitStreamVertex:
    pcVar5 = "EmitStreamVertex";
    break;
  case EOpEndStreamPrimitive:
    pcVar5 = "EndStreamPrimitive";
    break;
  case EOpBallot:
    pcVar5 = "ballot";
    break;
  case EOpReadFirstInvocation:
    pcVar5 = "readFirstInvocation";
    break;
  case EOpAnyInvocation:
    pcVar5 = "anyInvocation";
    break;
  case EOpAllInvocations:
    pcVar5 = "allInvocations";
    break;
  case EOpAllInvocationsEqual:
    pcVar5 = "allInvocationsEqual";
    break;
  case EOpSubgroupElect:
    pcVar5 = "subgroupElect";
    break;
  case EOpSubgroupAll:
    pcVar5 = "subgroupAll";
    break;
  case EOpSubgroupAny:
    pcVar5 = "subgroupAny";
    break;
  case EOpSubgroupAllEqual:
    pcVar5 = "subgroupAllEqual";
    break;
  case EOpSubgroupBroadcast:
    pcVar5 = "subgroupBroadcast";
    break;
  case EOpSubgroupBroadcastFirst:
    pcVar5 = "subgroupBroadcastFirst";
    break;
  case EOpSubgroupBallot:
    pcVar5 = "subgroupBallot";
    break;
  case EOpSubgroupInverseBallot:
    pcVar5 = "subgroupInverseBallot";
    break;
  case EOpSubgroupBallotBitExtract:
    pcVar5 = "subgroupBallotBitExtract";
    break;
  case EOpSubgroupBallotBitCount:
    pcVar5 = "subgroupBallotBitCount";
    break;
  case EOpSubgroupBallotInclusiveBitCount:
    pcVar5 = "subgroupBallotInclusiveBitCount";
    break;
  case EOpSubgroupBallotExclusiveBitCount:
    pcVar5 = "subgroupBallotExclusiveBitCount";
    break;
  case EOpSubgroupBallotFindLSB:
    pcVar5 = "subgroupBallotFindLSB";
    break;
  case EOpSubgroupBallotFindMSB:
    pcVar5 = "subgroupBallotFindMSB";
    break;
  case EOpSubgroupShuffle:
    pcVar5 = "subgroupShuffle";
    break;
  case EOpSubgroupShuffleXor:
    pcVar5 = "subgroupShuffleXor";
    break;
  case EOpSubgroupShuffleUp:
    pcVar5 = "subgroupShuffleUp";
    break;
  case EOpSubgroupShuffleDown:
    pcVar5 = "subgroupShuffleDown";
    break;
  case EOpSubgroupRotate:
    pcVar5 = "subgroupRotate";
    break;
  case EOpSubgroupClusteredRotate:
    pcVar5 = "subgroupClusteredRotate";
    break;
  case EOpSubgroupAdd:
    pcVar5 = "subgroupAdd";
    break;
  case EOpSubgroupMul:
    pcVar5 = "subgroupMul";
    break;
  case EOpSubgroupMin:
    pcVar5 = "subgroupMin";
    break;
  case EOpSubgroupMax:
    pcVar5 = "subgroupMax";
    break;
  case EOpSubgroupAnd:
    pcVar5 = "subgroupAnd";
    break;
  case EOpSubgroupOr:
    pcVar5 = "subgroupOr";
    break;
  case EOpSubgroupXor:
    pcVar5 = "subgroupXor";
    break;
  case EOpSubgroupInclusiveAdd:
    pcVar5 = "subgroupInclusiveAdd";
    break;
  case EOpSubgroupInclusiveMul:
    pcVar5 = "subgroupInclusiveMul";
    break;
  case EOpSubgroupInclusiveMin:
    pcVar5 = "subgroupInclusiveMin";
    break;
  case EOpSubgroupInclusiveMax:
    pcVar5 = "subgroupInclusiveMax";
    break;
  case EOpSubgroupInclusiveAnd:
    pcVar5 = "subgroupInclusiveAnd";
    break;
  case EOpSubgroupInclusiveOr:
    pcVar5 = "subgroupInclusiveOr";
    break;
  case EOpSubgroupInclusiveXor:
    pcVar5 = "subgroupInclusiveXor";
    break;
  case EOpSubgroupExclusiveAdd:
    pcVar5 = "subgroupExclusiveAdd";
    break;
  case EOpSubgroupExclusiveMul:
    pcVar5 = "subgroupExclusiveMul";
    break;
  case EOpSubgroupExclusiveMin:
    pcVar5 = "subgroupExclusiveMin";
    break;
  case EOpSubgroupExclusiveMax:
    pcVar5 = "subgroupExclusiveMax";
    break;
  case EOpSubgroupExclusiveAnd:
    pcVar5 = "subgroupExclusiveAnd";
    break;
  case EOpSubgroupExclusiveOr:
    pcVar5 = "subgroupExclusiveOr";
    break;
  case EOpSubgroupExclusiveXor:
    pcVar5 = "subgroupExclusiveXor";
    break;
  case EOpSubgroupClusteredAdd:
    pcVar5 = "subgroupClusteredAdd";
    break;
  case EOpSubgroupClusteredMul:
    pcVar5 = "subgroupClusteredMul";
    break;
  case EOpSubgroupClusteredMin:
    pcVar5 = "subgroupClusteredMin";
    break;
  case EOpSubgroupClusteredMax:
    pcVar5 = "subgroupClusteredMax";
    break;
  case EOpSubgroupClusteredAnd:
    pcVar5 = "subgroupClusteredAnd";
    break;
  case EOpSubgroupClusteredOr:
    pcVar5 = "subgroupClusteredOr";
    break;
  case EOpSubgroupClusteredXor:
    pcVar5 = "subgroupClusteredXor";
    break;
  case EOpSubgroupQuadBroadcast:
    pcVar5 = "subgroupQuadBroadcast";
    break;
  case EOpSubgroupQuadSwapHorizontal:
    pcVar5 = "subgroupQuadSwapHorizontal";
    break;
  case EOpSubgroupQuadSwapVertical:
    pcVar5 = "subgroupQuadSwapVertical";
    break;
  case EOpSubgroupQuadSwapDiagonal:
    pcVar5 = "subgroupQuadSwapDiagonal";
    break;
  case EOpSubgroupQuadAll:
    pcVar5 = "subgroupQuadAll";
    break;
  case EOpSubgroupQuadAny:
    pcVar5 = "subgroupQuadAny";
    break;
  case EOpSubgroupPartition:
    pcVar5 = "subgroupPartitionNV";
    break;
  case EOpSubgroupPartitionedAdd:
    pcVar5 = "subgroupPartitionedAddNV";
    break;
  case EOpSubgroupPartitionedMul:
    pcVar5 = "subgroupPartitionedMulNV";
    break;
  case EOpSubgroupPartitionedMin:
    pcVar5 = "subgroupPartitionedMinNV";
    break;
  case EOpSubgroupPartitionedMax:
    pcVar5 = "subgroupPartitionedMaxNV";
    break;
  case EOpSubgroupPartitionedAnd:
    pcVar5 = "subgroupPartitionedAndNV";
    break;
  case EOpSubgroupPartitionedOr:
    pcVar5 = "subgroupPartitionedOrNV";
    break;
  case EOpSubgroupPartitionedXor:
    pcVar5 = "subgroupPartitionedXorNV";
    break;
  case EOpSubgroupPartitionedInclusiveAdd:
    pcVar5 = "subgroupPartitionedInclusiveAddNV";
    break;
  case EOpSubgroupPartitionedInclusiveMul:
    pcVar5 = "subgroupPartitionedInclusiveMulNV";
    break;
  case EOpSubgroupPartitionedInclusiveMin:
    pcVar5 = "subgroupPartitionedInclusiveMinNV";
    break;
  case EOpSubgroupPartitionedInclusiveMax:
    pcVar5 = "subgroupPartitionedInclusiveMaxNV";
    break;
  case EOpSubgroupPartitionedInclusiveAnd:
    pcVar5 = "subgroupPartitionedInclusiveAndNV";
    break;
  case EOpSubgroupPartitionedInclusiveOr:
    pcVar5 = "subgroupPartitionedInclusiveOrNV";
    break;
  case EOpSubgroupPartitionedInclusiveXor:
    pcVar5 = "subgroupPartitionedInclusiveXorNV";
    break;
  case EOpSubgroupPartitionedExclusiveAdd:
    pcVar5 = "subgroupPartitionedExclusiveAddNV";
    break;
  case EOpSubgroupPartitionedExclusiveMul:
    pcVar5 = "subgroupPartitionedExclusiveMulNV";
    break;
  case EOpSubgroupPartitionedExclusiveMin:
    pcVar5 = "subgroupPartitionedExclusiveMinNV";
    break;
  case EOpSubgroupPartitionedExclusiveMax:
    pcVar5 = "subgroupPartitionedExclusiveMaxNV";
    break;
  case EOpSubgroupPartitionedExclusiveAnd:
    pcVar5 = "subgroupPartitionedExclusiveAndNV";
    break;
  case EOpSubgroupPartitionedExclusiveOr:
    pcVar5 = "subgroupPartitionedExclusiveOrNV";
    break;
  case EOpSubgroupPartitionedExclusiveXor:
    pcVar5 = "subgroupPartitionedExclusiveXorNV";
    break;
  case EOpMinInvocations:
    pcVar5 = "minInvocations";
    break;
  case EOpMaxInvocations:
    pcVar5 = "maxInvocations";
    break;
  case EOpAddInvocations:
    pcVar5 = "addInvocations";
    break;
  case EOpMinInvocationsNonUniform:
    pcVar5 = "minInvocationsNonUniform";
    break;
  case EOpMaxInvocationsNonUniform:
    pcVar5 = "maxInvocationsNonUniform";
    break;
  case EOpAddInvocationsNonUniform:
    pcVar5 = "addInvocationsNonUniform";
    break;
  case EOpMinInvocationsInclusiveScan:
    pcVar5 = "minInvocationsInclusiveScan";
    break;
  case EOpMaxInvocationsInclusiveScan:
    pcVar5 = "maxInvocationsInclusiveScan";
    break;
  case EOpAddInvocationsInclusiveScan:
    pcVar5 = "addInvocationsInclusiveScan";
    break;
  case EOpMinInvocationsInclusiveScanNonUniform:
    pcVar5 = "minInvocationsInclusiveScanNonUniform";
    break;
  case EOpMaxInvocationsInclusiveScanNonUniform:
    pcVar5 = "maxInvocationsInclusiveScanNonUniform";
    break;
  case EOpAddInvocationsInclusiveScanNonUniform:
    pcVar5 = "addInvocationsInclusiveScanNonUniform";
    break;
  case EOpMinInvocationsExclusiveScan:
    pcVar5 = "minInvocationsExclusiveScan";
    break;
  case EOpMaxInvocationsExclusiveScan:
    pcVar5 = "maxInvocationsExclusiveScan";
    break;
  case EOpAddInvocationsExclusiveScan:
    pcVar5 = "addInvocationsExclusiveScan";
    break;
  case EOpMinInvocationsExclusiveScanNonUniform:
    pcVar5 = "minInvocationsExclusiveScanNonUniform";
    break;
  case EOpMaxInvocationsExclusiveScanNonUniform:
    pcVar5 = "maxInvocationsExclusiveScanNonUniform";
    break;
  case EOpAddInvocationsExclusiveScanNonUniform:
    pcVar5 = "addInvocationsExclusiveScanNonUniform";
    break;
  case EOpMbcnt:
    pcVar5 = "mbcnt";
    break;
  case EOpCubeFaceIndex:
    pcVar5 = "cubeFaceIndex";
    break;
  case EOpCubeFaceCoord:
    pcVar5 = "cubeFaceCoord";
    break;
  case EOpAtomicCounterIncrement:
    pcVar5 = "AtomicCounterIncrement";
    break;
  case EOpAtomicCounterDecrement:
    pcVar5 = "AtomicCounterDecrement";
    break;
  case EOpAtomicCounter:
    pcVar5 = "AtomicCounter";
    break;
  case EOpAny:
    pcVar5 = "any";
    break;
  case EOpAll:
    pcVar5 = "all";
    break;
  case EOpCreateTensorLayoutNV:
    pcVar5 = "createTensorLayoutNV";
    break;
  case EOpTensorLayoutSetBlockSizeNV:
    pcVar5 = "setTensorLayoutBlockSizeNV";
    break;
  case EOpTensorLayoutSetDimensionNV:
    pcVar5 = "setTensorLayoutDimensionNV";
    break;
  case EOpTensorLayoutSetStrideNV:
    pcVar5 = "setTensorLayoutStrideNV";
    break;
  case EOpTensorLayoutSliceNV:
    pcVar5 = "sliceTensorLayoutNV";
    break;
  case EOpTensorLayoutSetClampValueNV:
    pcVar5 = "setTensorLayoutClampValueNV";
    break;
  case EOpCreateTensorViewNV:
    pcVar5 = "createTensorViewNV";
    break;
  case EOpTensorViewSetDimensionNV:
    pcVar5 = "setTensorViewDimensionsNV";
    break;
  case EOpTensorViewSetStrideNV:
    pcVar5 = "setTensorViewStrideNV";
    break;
  case EOpTensorViewSetClipNV:
    pcVar5 = "setTensorViewClipNV";
    break;
  case EOpConstructReference:
    pcVar5 = "Construct reference type";
    break;
  case EOpArrayLength:
    pcVar5 = "array length";
    break;
  case EOpImageQuerySize:
    pcVar5 = "imageQuerySize";
    break;
  case EOpImageQuerySamples:
    pcVar5 = "imageQuerySamples";
    break;
  case EOpImageLoad:
    pcVar5 = "imageLoad";
    break;
  case EOpSubpassLoad:
    pcVar5 = "subpassLoad";
    break;
  case EOpSubpassLoadMS:
    pcVar5 = "subpassLoadMS";
    break;
  case EOpColorAttachmentReadEXT:
    pcVar5 = "colorAttachmentReadEXT";
    break;
  case EOpTextureQuerySize:
    pcVar5 = "textureSize";
    break;
  case EOpTextureQueryLod:
    pcVar5 = "textureQueryLod";
    break;
  case EOpTextureQueryLevels:
    pcVar5 = "textureQueryLevels";
    break;
  case EOpTextureQuerySamples:
    pcVar5 = "textureSamples";
    break;
  case EOpFragmentMaskFetch:
    pcVar5 = "fragmentMaskFetchAMD";
    break;
  case EOpFragmentFetch:
    pcVar5 = "fragmentFetchAMD";
    break;
  case EOpSparseTexelsResident:
    pcVar5 = "sparseTexelsResident";
    break;
  case EOpBitFieldReverse:
    pcVar5 = "bitFieldReverse";
    break;
  case EOpBitCount:
    pcVar5 = "bitCount";
    break;
  case EOpFindLSB:
    pcVar5 = "findLSB";
    break;
  case EOpFindMSB:
    pcVar5 = "findMSB";
    break;
  case EOpCountLeadingZeros:
    pcVar5 = "countLeadingZeros";
    break;
  case EOpCountTrailingZeros:
    pcVar5 = "countTrailingZeros";
    break;
  default:
    switch(TVar1) {
    case EOpClip:
      pcVar5 = "clip";
      break;
    case EOpIsFinite:
      pcVar5 = "isfinite";
      break;
    case EOpLog10:
      pcVar5 = "log10";
      break;
    case EOpRcp:
      pcVar5 = "rcp";
      break;
    case EOpSaturate:
      pcVar5 = "saturate";
      break;
    default:
      goto switchD_003ed9ad_caseD_12;
    }
  }
  TInfoSinkBase::append(&infoSink->debug,pcVar5);
LAB_003ee95c:
  pTVar6 = &infoSink->debug;
  TInfoSinkBase::append(pTVar6," (");
  TIntermOperator::getCompleteString_abi_cxx11_(&local_40,&node->super_TIntermOperator);
  TInfoSinkBase::append(pTVar6,&local_40);
  TInfoSinkBase::append(pTVar6,")");
  TInfoSinkBase::append(pTVar6,"\n");
  return true;
}

Assistant:

bool TOutputTraverser::visitUnary(TVisit /* visit */, TIntermUnary* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    if (IsOpNumericConv(node->getAsOperator()->getOp())) {
        out.debug << "Convert " << TType::getBasicString(node->getOperand()->getType().getBasicType()) << " to " << TType::getBasicString(node->getType().getBasicType());
        out.debug << " (" << node->getCompleteString() << ")";
        out.debug << "\n";
        return true;
    }

    switch (node->getOp()) {
    case EOpNegative:       out.debug << "Negate value";         break;
    case EOpVectorLogicalNot:
    case EOpLogicalNot:     out.debug << "Negate conditional";   break;
    case EOpBitwiseNot:     out.debug << "Bitwise not";          break;

    case EOpPostIncrement:  out.debug << "Post-Increment";       break;
    case EOpPostDecrement:  out.debug << "Post-Decrement";       break;
    case EOpPreIncrement:   out.debug << "Pre-Increment";        break;
    case EOpPreDecrement:   out.debug << "Pre-Decrement";        break;
    case EOpCopyObject:     out.debug << "copy object";          break;

    case EOpConvUint64ToPtr:  out.debug << "Convert uint64_t to pointer";   break;
    case EOpConvPtrToUint64:  out.debug << "Convert pointer to uint64_t";   break;

    case EOpConvUint64ToAccStruct: out.debug << "Convert uint64_t to acceleration structure"; break;
    case EOpConvUvec2ToAccStruct:  out.debug << "Convert uvec2 to acceleration strucuture "; break;

    case EOpRadians:        out.debug << "radians";              break;
    case EOpDegrees:        out.debug << "degrees";              break;
    case EOpSin:            out.debug << "sine";                 break;
    case EOpCos:            out.debug << "cosine";               break;
    case EOpTan:            out.debug << "tangent";              break;
    case EOpAsin:           out.debug << "arc sine";             break;
    case EOpAcos:           out.debug << "arc cosine";           break;
    case EOpAtan:           out.debug << "arc tangent";          break;
    case EOpSinh:           out.debug << "hyp. sine";            break;
    case EOpCosh:           out.debug << "hyp. cosine";          break;
    case EOpTanh:           out.debug << "hyp. tangent";         break;
    case EOpAsinh:          out.debug << "arc hyp. sine";        break;
    case EOpAcosh:          out.debug << "arc hyp. cosine";      break;
    case EOpAtanh:          out.debug << "arc hyp. tangent";     break;

    case EOpExp:            out.debug << "exp";                  break;
    case EOpLog:            out.debug << "log";                  break;
    case EOpExp2:           out.debug << "exp2";                 break;
    case EOpLog2:           out.debug << "log2";                 break;
    case EOpSqrt:           out.debug << "sqrt";                 break;
    case EOpInverseSqrt:    out.debug << "inverse sqrt";         break;

    case EOpAbs:            out.debug << "Absolute value";       break;
    case EOpSign:           out.debug << "Sign";                 break;
    case EOpFloor:          out.debug << "Floor";                break;
    case EOpTrunc:          out.debug << "trunc";                break;
    case EOpRound:          out.debug << "round";                break;
    case EOpRoundEven:      out.debug << "roundEven";            break;
    case EOpCeil:           out.debug << "Ceiling";              break;
    case EOpFract:          out.debug << "Fraction";             break;

    case EOpIsNan:          out.debug << "isnan";                break;
    case EOpIsInf:          out.debug << "isinf";                break;

    case EOpFloatBitsToInt: out.debug << "floatBitsToInt";       break;
    case EOpFloatBitsToUint:out.debug << "floatBitsToUint";      break;
    case EOpIntBitsToFloat: out.debug << "intBitsToFloat";       break;
    case EOpUintBitsToFloat:out.debug << "uintBitsToFloat";      break;
    case EOpDoubleBitsToInt64:  out.debug << "doubleBitsToInt64";  break;
    case EOpDoubleBitsToUint64: out.debug << "doubleBitsToUint64"; break;
    case EOpInt64BitsToDouble:  out.debug << "int64BitsToDouble";  break;
    case EOpUint64BitsToDouble: out.debug << "uint64BitsToDouble"; break;
    case EOpFloat16BitsToInt16:  out.debug << "float16BitsToInt16";  break;
    case EOpFloat16BitsToUint16: out.debug << "float16BitsToUint16"; break;
    case EOpInt16BitsToFloat16:  out.debug << "int16BitsToFloat16";  break;
    case EOpUint16BitsToFloat16: out.debug << "uint16BitsToFloat16"; break;

    case EOpPackSnorm2x16:  out.debug << "packSnorm2x16";        break;
    case EOpUnpackSnorm2x16:out.debug << "unpackSnorm2x16";      break;
    case EOpPackUnorm2x16:  out.debug << "packUnorm2x16";        break;
    case EOpUnpackUnorm2x16:out.debug << "unpackUnorm2x16";      break;
    case EOpPackHalf2x16:   out.debug << "packHalf2x16";         break;
    case EOpUnpackHalf2x16: out.debug << "unpackHalf2x16";       break;
    case EOpPack16:           out.debug << "pack16";                 break;
    case EOpPack32:           out.debug << "pack32";                 break;
    case EOpPack64:           out.debug << "pack64";                 break;
    case EOpUnpack32:         out.debug << "unpack32";               break;
    case EOpUnpack16:         out.debug << "unpack16";               break;
    case EOpUnpack8:          out.debug << "unpack8";               break;

    case EOpPackSnorm4x8:     out.debug << "PackSnorm4x8";       break;
    case EOpUnpackSnorm4x8:   out.debug << "UnpackSnorm4x8";     break;
    case EOpPackUnorm4x8:     out.debug << "PackUnorm4x8";       break;
    case EOpUnpackUnorm4x8:   out.debug << "UnpackUnorm4x8";     break;
    case EOpPackDouble2x32:   out.debug << "PackDouble2x32";     break;
    case EOpUnpackDouble2x32: out.debug << "UnpackDouble2x32";   break;

    case EOpPackInt2x32:      out.debug << "packInt2x32";        break;
    case EOpUnpackInt2x32:    out.debug << "unpackInt2x32";      break;
    case EOpPackUint2x32:     out.debug << "packUint2x32";       break;
    case EOpUnpackUint2x32:   out.debug << "unpackUint2x32";     break;

    case EOpPackInt2x16:      out.debug << "packInt2x16";        break;
    case EOpUnpackInt2x16:    out.debug << "unpackInt2x16";      break;
    case EOpPackUint2x16:     out.debug << "packUint2x16";       break;
    case EOpUnpackUint2x16:   out.debug << "unpackUint2x16";     break;

    case EOpPackInt4x16:      out.debug << "packInt4x16";        break;
    case EOpUnpackInt4x16:    out.debug << "unpackInt4x16";      break;
    case EOpPackUint4x16:     out.debug << "packUint4x16";       break;
    case EOpUnpackUint4x16:   out.debug << "unpackUint4x16";     break;
    case EOpPackFloat2x16:    out.debug << "packFloat2x16";      break;
    case EOpUnpackFloat2x16:  out.debug << "unpackFloat2x16";    break;

    case EOpLength:         out.debug << "length";               break;
    case EOpNormalize:      out.debug << "normalize";            break;
    case EOpDPdx:           out.debug << "dPdx";                 break;
    case EOpDPdy:           out.debug << "dPdy";                 break;
    case EOpFwidth:         out.debug << "fwidth";               break;
    case EOpDPdxFine:       out.debug << "dPdxFine";             break;
    case EOpDPdyFine:       out.debug << "dPdyFine";             break;
    case EOpFwidthFine:     out.debug << "fwidthFine";           break;
    case EOpDPdxCoarse:     out.debug << "dPdxCoarse";           break;
    case EOpDPdyCoarse:     out.debug << "dPdyCoarse";           break;
    case EOpFwidthCoarse:   out.debug << "fwidthCoarse";         break;

    case EOpInterpolateAtCentroid: out.debug << "interpolateAtCentroid";  break;

    case EOpDeterminant:    out.debug << "determinant";          break;
    case EOpMatrixInverse:  out.debug << "inverse";              break;
    case EOpTranspose:      out.debug << "transpose";            break;

    case EOpAny:            out.debug << "any";                  break;
    case EOpAll:            out.debug << "all";                  break;

    case EOpArrayLength:    out.debug << "array length";         break;

    case EOpEmitStreamVertex:   out.debug << "EmitStreamVertex";   break;
    case EOpEndStreamPrimitive: out.debug << "EndStreamPrimitive"; break;

    case EOpAtomicCounterIncrement: out.debug << "AtomicCounterIncrement";break;
    case EOpAtomicCounterDecrement: out.debug << "AtomicCounterDecrement";break;
    case EOpAtomicCounter:          out.debug << "AtomicCounter";         break;

    case EOpTextureQuerySize:       out.debug << "textureSize";           break;
    case EOpTextureQueryLod:        out.debug << "textureQueryLod";       break;
    case EOpTextureQueryLevels:     out.debug << "textureQueryLevels";    break;
    case EOpTextureQuerySamples:    out.debug << "textureSamples";        break;
    case EOpImageQuerySize:         out.debug << "imageQuerySize";        break;
    case EOpImageQuerySamples:      out.debug << "imageQuerySamples";     break;
    case EOpImageLoad:              out.debug << "imageLoad";             break;

    case EOpBitFieldReverse:        out.debug << "bitFieldReverse";       break;
    case EOpBitCount:               out.debug << "bitCount";              break;
    case EOpFindLSB:                out.debug << "findLSB";               break;
    case EOpFindMSB:                out.debug << "findMSB";               break;

    case EOpCountLeadingZeros:      out.debug << "countLeadingZeros";     break;
    case EOpCountTrailingZeros:     out.debug << "countTrailingZeros";    break;

    case EOpNoise:                  out.debug << "noise";                 break;

    case EOpBallot:                 out.debug << "ballot";                break;
    case EOpReadFirstInvocation:    out.debug << "readFirstInvocation";   break;

    case EOpAnyInvocation:          out.debug << "anyInvocation";         break;
    case EOpAllInvocations:         out.debug << "allInvocations";        break;
    case EOpAllInvocationsEqual:    out.debug << "allInvocationsEqual";   break;

    case EOpSubgroupElect:                   out.debug << "subgroupElect";                   break;
    case EOpSubgroupAll:                     out.debug << "subgroupAll";                     break;
    case EOpSubgroupAny:                     out.debug << "subgroupAny";                     break;
    case EOpSubgroupAllEqual:                out.debug << "subgroupAllEqual";                break;
    case EOpSubgroupBroadcast:               out.debug << "subgroupBroadcast";               break;
    case EOpSubgroupBroadcastFirst:          out.debug << "subgroupBroadcastFirst";          break;
    case EOpSubgroupBallot:                  out.debug << "subgroupBallot";                  break;
    case EOpSubgroupInverseBallot:           out.debug << "subgroupInverseBallot";           break;
    case EOpSubgroupBallotBitExtract:        out.debug << "subgroupBallotBitExtract";        break;
    case EOpSubgroupBallotBitCount:          out.debug << "subgroupBallotBitCount";          break;
    case EOpSubgroupBallotInclusiveBitCount: out.debug << "subgroupBallotInclusiveBitCount"; break;
    case EOpSubgroupBallotExclusiveBitCount: out.debug << "subgroupBallotExclusiveBitCount"; break;
    case EOpSubgroupBallotFindLSB:           out.debug << "subgroupBallotFindLSB";           break;
    case EOpSubgroupBallotFindMSB:           out.debug << "subgroupBallotFindMSB";           break;
    case EOpSubgroupShuffle:                 out.debug << "subgroupShuffle";                 break;
    case EOpSubgroupShuffleXor:              out.debug << "subgroupShuffleXor";              break;
    case EOpSubgroupShuffleUp:               out.debug << "subgroupShuffleUp";               break;
    case EOpSubgroupShuffleDown:             out.debug << "subgroupShuffleDown";             break;
    case EOpSubgroupRotate:                  out.debug << "subgroupRotate";                  break;
    case EOpSubgroupClusteredRotate:         out.debug << "subgroupClusteredRotate";         break;
    case EOpSubgroupAdd:                     out.debug << "subgroupAdd";                     break;
    case EOpSubgroupMul:                     out.debug << "subgroupMul";                     break;
    case EOpSubgroupMin:                     out.debug << "subgroupMin";                     break;
    case EOpSubgroupMax:                     out.debug << "subgroupMax";                     break;
    case EOpSubgroupAnd:                     out.debug << "subgroupAnd";                     break;
    case EOpSubgroupOr:                      out.debug << "subgroupOr";                      break;
    case EOpSubgroupXor:                     out.debug << "subgroupXor";                     break;
    case EOpSubgroupInclusiveAdd:            out.debug << "subgroupInclusiveAdd";            break;
    case EOpSubgroupInclusiveMul:            out.debug << "subgroupInclusiveMul";            break;
    case EOpSubgroupInclusiveMin:            out.debug << "subgroupInclusiveMin";            break;
    case EOpSubgroupInclusiveMax:            out.debug << "subgroupInclusiveMax";            break;
    case EOpSubgroupInclusiveAnd:            out.debug << "subgroupInclusiveAnd";            break;
    case EOpSubgroupInclusiveOr:             out.debug << "subgroupInclusiveOr";             break;
    case EOpSubgroupInclusiveXor:            out.debug << "subgroupInclusiveXor";            break;
    case EOpSubgroupExclusiveAdd:            out.debug << "subgroupExclusiveAdd";            break;
    case EOpSubgroupExclusiveMul:            out.debug << "subgroupExclusiveMul";            break;
    case EOpSubgroupExclusiveMin:            out.debug << "subgroupExclusiveMin";            break;
    case EOpSubgroupExclusiveMax:            out.debug << "subgroupExclusiveMax";            break;
    case EOpSubgroupExclusiveAnd:            out.debug << "subgroupExclusiveAnd";            break;
    case EOpSubgroupExclusiveOr:             out.debug << "subgroupExclusiveOr";             break;
    case EOpSubgroupExclusiveXor:            out.debug << "subgroupExclusiveXor";            break;
    case EOpSubgroupClusteredAdd:            out.debug << "subgroupClusteredAdd";            break;
    case EOpSubgroupClusteredMul:            out.debug << "subgroupClusteredMul";            break;
    case EOpSubgroupClusteredMin:            out.debug << "subgroupClusteredMin";            break;
    case EOpSubgroupClusteredMax:            out.debug << "subgroupClusteredMax";            break;
    case EOpSubgroupClusteredAnd:            out.debug << "subgroupClusteredAnd";            break;
    case EOpSubgroupClusteredOr:             out.debug << "subgroupClusteredOr";             break;
    case EOpSubgroupClusteredXor:            out.debug << "subgroupClusteredXor";            break;
    case EOpSubgroupQuadBroadcast:           out.debug << "subgroupQuadBroadcast";           break;
    case EOpSubgroupQuadSwapHorizontal:      out.debug << "subgroupQuadSwapHorizontal";      break;
    case EOpSubgroupQuadSwapVertical:        out.debug << "subgroupQuadSwapVertical";        break;
    case EOpSubgroupQuadSwapDiagonal:        out.debug << "subgroupQuadSwapDiagonal";        break;
    case EOpSubgroupQuadAll:                 out.debug << "subgroupQuadAll";                 break;
    case EOpSubgroupQuadAny:                 out.debug << "subgroupQuadAny";                 break;

    case EOpSubgroupPartition:                          out.debug << "subgroupPartitionNV";                          break;
    case EOpSubgroupPartitionedAdd:                     out.debug << "subgroupPartitionedAddNV";                     break;
    case EOpSubgroupPartitionedMul:                     out.debug << "subgroupPartitionedMulNV";                     break;
    case EOpSubgroupPartitionedMin:                     out.debug << "subgroupPartitionedMinNV";                     break;
    case EOpSubgroupPartitionedMax:                     out.debug << "subgroupPartitionedMaxNV";                     break;
    case EOpSubgroupPartitionedAnd:                     out.debug << "subgroupPartitionedAndNV";                     break;
    case EOpSubgroupPartitionedOr:                      out.debug << "subgroupPartitionedOrNV";                      break;
    case EOpSubgroupPartitionedXor:                     out.debug << "subgroupPartitionedXorNV";                     break;
    case EOpSubgroupPartitionedInclusiveAdd:            out.debug << "subgroupPartitionedInclusiveAddNV";            break;
    case EOpSubgroupPartitionedInclusiveMul:            out.debug << "subgroupPartitionedInclusiveMulNV";            break;
    case EOpSubgroupPartitionedInclusiveMin:            out.debug << "subgroupPartitionedInclusiveMinNV";            break;
    case EOpSubgroupPartitionedInclusiveMax:            out.debug << "subgroupPartitionedInclusiveMaxNV";            break;
    case EOpSubgroupPartitionedInclusiveAnd:            out.debug << "subgroupPartitionedInclusiveAndNV";            break;
    case EOpSubgroupPartitionedInclusiveOr:             out.debug << "subgroupPartitionedInclusiveOrNV";             break;
    case EOpSubgroupPartitionedInclusiveXor:            out.debug << "subgroupPartitionedInclusiveXorNV";            break;
    case EOpSubgroupPartitionedExclusiveAdd:            out.debug << "subgroupPartitionedExclusiveAddNV";            break;
    case EOpSubgroupPartitionedExclusiveMul:            out.debug << "subgroupPartitionedExclusiveMulNV";            break;
    case EOpSubgroupPartitionedExclusiveMin:            out.debug << "subgroupPartitionedExclusiveMinNV";            break;
    case EOpSubgroupPartitionedExclusiveMax:            out.debug << "subgroupPartitionedExclusiveMaxNV";            break;
    case EOpSubgroupPartitionedExclusiveAnd:            out.debug << "subgroupPartitionedExclusiveAndNV";            break;
    case EOpSubgroupPartitionedExclusiveOr:             out.debug << "subgroupPartitionedExclusiveOrNV";             break;
    case EOpSubgroupPartitionedExclusiveXor:            out.debug << "subgroupPartitionedExclusiveXorNV";            break;

    case EOpClip:                   out.debug << "clip";                  break;
    case EOpIsFinite:               out.debug << "isfinite";              break;
    case EOpLog10:                  out.debug << "log10";                 break;
    case EOpRcp:                    out.debug << "rcp";                   break;
    case EOpSaturate:               out.debug << "saturate";              break;

    case EOpSparseTexelsResident:   out.debug << "sparseTexelsResident";  break;

    case EOpMinInvocations:             out.debug << "minInvocations";              break;
    case EOpMaxInvocations:             out.debug << "maxInvocations";              break;
    case EOpAddInvocations:             out.debug << "addInvocations";              break;
    case EOpMinInvocationsNonUniform:   out.debug << "minInvocationsNonUniform";    break;
    case EOpMaxInvocationsNonUniform:   out.debug << "maxInvocationsNonUniform";    break;
    case EOpAddInvocationsNonUniform:   out.debug << "addInvocationsNonUniform";    break;

    case EOpMinInvocationsInclusiveScan:            out.debug << "minInvocationsInclusiveScan";             break;
    case EOpMaxInvocationsInclusiveScan:            out.debug << "maxInvocationsInclusiveScan";             break;
    case EOpAddInvocationsInclusiveScan:            out.debug << "addInvocationsInclusiveScan";             break;
    case EOpMinInvocationsInclusiveScanNonUniform:  out.debug << "minInvocationsInclusiveScanNonUniform";   break;
    case EOpMaxInvocationsInclusiveScanNonUniform:  out.debug << "maxInvocationsInclusiveScanNonUniform";   break;
    case EOpAddInvocationsInclusiveScanNonUniform:  out.debug << "addInvocationsInclusiveScanNonUniform";   break;

    case EOpMinInvocationsExclusiveScan:            out.debug << "minInvocationsExclusiveScan";             break;
    case EOpMaxInvocationsExclusiveScan:            out.debug << "maxInvocationsExclusiveScan";             break;
    case EOpAddInvocationsExclusiveScan:            out.debug << "addInvocationsExclusiveScan";             break;
    case EOpMinInvocationsExclusiveScanNonUniform:  out.debug << "minInvocationsExclusiveScanNonUniform";   break;
    case EOpMaxInvocationsExclusiveScanNonUniform:  out.debug << "maxInvocationsExclusiveScanNonUniform";   break;
    case EOpAddInvocationsExclusiveScanNonUniform:  out.debug << "addInvocationsExclusiveScanNonUniform";   break;

    case EOpMbcnt:                  out.debug << "mbcnt";                       break;

    case EOpFragmentMaskFetch:      out.debug << "fragmentMaskFetchAMD";        break;
    case EOpFragmentFetch:          out.debug << "fragmentFetchAMD";            break;

    case EOpCubeFaceIndex:          out.debug << "cubeFaceIndex";               break;
    case EOpCubeFaceCoord:          out.debug << "cubeFaceCoord";               break;

    case EOpSubpassLoad:   out.debug << "subpassLoad";   break;
    case EOpSubpassLoadMS: out.debug << "subpassLoadMS"; break;

    case EOpColorAttachmentReadEXT:   out.debug << "colorAttachmentReadEXT";   break;

    case EOpConstructReference: out.debug << "Construct reference type"; break;

    case EOpDeclare: out.debug << "Declare"; break;

    case EOpSpirvInst: out.debug << "spirv_instruction"; break;

    case EOpCreateTensorLayoutNV:           out.debug << "createTensorLayoutNV"; break;
    case EOpTensorLayoutSetBlockSizeNV:     out.debug << "setTensorLayoutBlockSizeNV"; break;
    case EOpTensorLayoutSetDimensionNV:     out.debug << "setTensorLayoutDimensionNV"; break;
    case EOpTensorLayoutSetStrideNV:        out.debug << "setTensorLayoutStrideNV"; break;
    case EOpTensorLayoutSliceNV:            out.debug << "sliceTensorLayoutNV"; break;
    case EOpTensorLayoutSetClampValueNV:    out.debug << "setTensorLayoutClampValueNV"; break;
    case EOpCreateTensorViewNV:             out.debug << "createTensorViewNV"; break;
    case EOpTensorViewSetDimensionNV:       out.debug << "setTensorViewDimensionsNV"; break;
    case EOpTensorViewSetStrideNV:          out.debug << "setTensorViewStrideNV"; break;
    case EOpTensorViewSetClipNV:            out.debug << "setTensorViewClipNV"; break;

    default: out.debug.message(EPrefixError, "Bad unary op");
    }

    out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}